

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * get_dir(char *path,char *dest)

{
  _Bool _Var1;
  char *str;
  char *in_RSI;
  char *in_RDI;
  char *p;
  char temp [260];
  size_t in_stack_fffffffffffffec8;
  char local_128 [8];
  char *in_stack_fffffffffffffee0;
  char *local_8;
  
  if (in_RSI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    _Var1 = has_driveletter(in_RDI);
    if (_Var1) {
      strcpy(local_128,in_RDI + 2);
    }
    else {
      strcpy(local_128,in_RDI);
    }
    str = point_basename(in_stack_fffffffffffffee0);
    if (str != (char *)0x0) {
      *str = '\0';
    }
    clear_path_string(str,in_stack_fffffffffffffec8);
    strcpy(in_RSI,local_128);
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

char *get_dir(const char *path, char *dest)
{
	if (dest == NULL)
	{
		return NULL;
	}
	char temp[MAX_PATH];
	if (has_driveletter(path))
	{
		strcpy(temp, path + 2);
	}
	else
	{
		strcpy(temp, path);
	}
	char *p = point_basename(temp);
	if (p != NULL)
	{
		*p = '\0';
	}
	clear_path_string(dest, MAX_PATH);
	strcpy(dest, temp);
	return dest;
}